

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  Mat *pMVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  Mat *b;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int y;
  uint uVar18;
  Mat *m;
  long lVar19;
  uint uVar20;
  float *pfVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  Mat *pMVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int z;
  uint uVar29;
  undefined1 (*pauVar30) [16];
  undefined8 *puVar31;
  int iVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  undefined4 *puVar35;
  float *pfVar36;
  undefined1 (*pauVar37) [16];
  bool bVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar42 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar43 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  __m128 afVar87;
  binary_op_ratan2 op;
  __m128 _b_4;
  __m128 _b;
  float local_48;
  float fStack_44;
  Option *opt_00;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  b = pMVar2 + 1;
  iVar23 = pMVar2[1].h * pMVar2[1].w * pMVar2[1].d * pMVar2[1].c * pMVar2[1].elempack;
  if (((pMVar2->dims < pMVar2[1].dims) && (iVar23 != 1)) ||
     (pMVar2->c * pMVar2->elempack * pMVar2->d * pMVar2->h * pMVar2->w < iVar23)) {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]);
    switch(uVar11) {
    case 1:
      uVar11 = 7;
      break;
    case 3:
      uVar11 = 8;
      break;
    case 6:
      uVar11 = 9;
      break;
    case 7:
      uVar11 = 1;
      break;
    case 8:
      uVar11 = 3;
      break;
    case 9:
      uVar11 = 6;
      break;
    case 10:
      uVar11 = 0xb;
      break;
    case 0xb:
      uVar11 = 10;
    }
    m = b;
    b = pMVar2;
  }
  else {
    uVar11 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]);
    m = pMVar2;
  }
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create_like(pMVar2,m,opt->blob_allocator);
  if (pMVar2->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar2->c * pMVar2->cstep == 0) {
    return -100;
  }
  iVar23 = b->elempack;
  uVar29 = b->w;
  iVar32 = b->h;
  iVar13 = b->d;
  uVar14 = iVar32 * uVar29 * iVar13;
  opt_00 = (Option *)(ulong)uVar14;
  uVar16 = b->c;
  if (uVar16 * iVar23 * uVar14 != 1) {
    uVar18 = m->dims;
    uVar20 = b->dims;
    if ((((uVar18 != uVar20) || (m->w != uVar29)) ||
        ((m->h != iVar32 || ((m->d != iVar13 || (m->c != uVar16)))))) || (m->elempack != iVar23)) {
      if ((int)uVar20 < (int)uVar18) {
LAB_00345229:
        binary_op_broadcast_inner(m,b,pMVar2,uVar11,(Option *)(ulong)uVar20);
        goto switchD_00345174_default;
      }
      if (uVar18 == 2) {
        if ((uVar29 == 1) && (iVar32 == m->h)) goto LAB_00345229;
LAB_0034529d:
        bVar38 = false;
LAB_003452a0:
        bVar10 = false;
      }
      else {
        if (uVar18 == 4) {
          bVar38 = true;
          if ((uVar29 == 1) &&
             (((iVar32 == 1 &&
               (((iVar13 == 1 && (uVar16 == m->c)) || ((iVar13 == m->d && (uVar16 == m->c)))))) ||
              (((iVar32 == m->h && (iVar13 == m->d)) && (uVar16 == m->c)))))) goto LAB_00345229;
          goto LAB_003452a0;
        }
        if (uVar18 != 3) goto LAB_0034529d;
        bVar10 = true;
        if ((uVar29 == 1) &&
           (((iVar32 == 1 && (uVar16 == m->c)) || ((iVar32 == m->h && (uVar16 == m->c))))))
        goto LAB_00345229;
        bVar38 = false;
      }
      if ((iVar23 == 1) &&
         (((((uVar18 == 2 && (iVar32 == 1)) && (uVar29 == m->w)) ||
           ((bVar10 &&
            ((((uVar16 == 1 && (iVar32 == 1)) && (uVar29 == m->w)) ||
             (((uVar29 == m->w && (uVar16 == 1)) && (iVar32 == m->h)))))))) ||
          ((bVar38 &&
           (((((uVar16 == 1 && (iVar13 == 1)) && (iVar32 == 1)) && (uVar29 == m->w)) ||
            ((uVar29 == m->w &&
             ((((uVar16 == 1 && (iVar13 == 1)) && (iVar32 == m->h)) ||
              (((iVar32 == m->h && (uVar16 == 1)) && (iVar13 == m->d)))))))))))))) {
        switch(uVar11) {
        case 0:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  auVar65 = *pauVar34;
                  fVar40 = *pfVar36;
                  auVar61._0_4_ = fVar40 + auVar65._0_4_;
                  auVar61._4_4_ = fVar40 + auVar65._4_4_;
                  auVar61._8_4_ = fVar40 + auVar65._8_4_;
                  auVar61._12_4_ = fVar40 + auVar65._12_4_;
                  *pauVar37 = auVar61;
                  pauVar34 = pauVar34 + 1;
                  pfVar36 = pfVar36 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar37 + lVar19 * 4) =
                       pfVar36[lVar19] + *(float *)(*pauVar34 + lVar19 * 4);
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar36 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    auVar65 = *pauVar34;
                    fVar40 = *pfVar36;
                    auVar74._0_4_ = fVar40 + auVar65._0_4_;
                    auVar74._4_4_ = fVar40 + auVar65._4_4_;
                    auVar74._8_4_ = fVar40 + auVar65._8_4_;
                    auVar74._12_4_ = fVar40 + auVar65._12_4_;
                    *pauVar37 = auVar74;
                    pauVar34 = pauVar34 + 1;
                    pfVar36 = pfVar36 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar37 + lVar19 * 4) =
                         pfVar36[lVar19] + *(float *)(*pauVar34 + lVar19 * 4);
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 1:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pfVar21 = (float *)((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar34 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  fVar40 = *pfVar36;
                  auVar46._0_4_ = *pfVar21 - fVar40;
                  auVar46._4_4_ = pfVar21[1] - fVar40;
                  auVar46._8_4_ = pfVar21[2] - fVar40;
                  auVar46._12_4_ = pfVar21[3] - fVar40;
                  *pauVar34 = auVar46;
                  pfVar21 = pfVar21 + 4;
                  pfVar36 = pfVar36 + 1;
                  pauVar34 = pauVar34 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar34 + lVar19 * 4) = pfVar21[lVar19] - pfVar36[lVar19];
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pfVar36 = (float *)(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar21 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    fVar40 = *pfVar21;
                    auVar51._0_4_ = *pfVar36 - fVar40;
                    auVar51._4_4_ = pfVar36[1] - fVar40;
                    auVar51._8_4_ = pfVar36[2] - fVar40;
                    auVar51._12_4_ = pfVar36[3] - fVar40;
                    *pauVar34 = auVar51;
                    pfVar36 = pfVar36 + 4;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar34 + lVar19 * 4) = pfVar36[lVar19] - pfVar21[lVar19];
                    lVar24 = lVar24 + -4;
                  }
                  pfVar36 = (float *)((long)pfVar36 - lVar24);
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                }
              }
            }
          }
          return 0;
        case 2:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  auVar65 = *pauVar34;
                  fVar40 = *pfVar36;
                  auVar68._0_4_ = fVar40 * auVar65._0_4_;
                  auVar68._4_4_ = fVar40 * auVar65._4_4_;
                  auVar68._8_4_ = fVar40 * auVar65._8_4_;
                  auVar68._12_4_ = fVar40 * auVar65._12_4_;
                  *pauVar37 = auVar68;
                  pauVar34 = pauVar34 + 1;
                  pfVar36 = pfVar36 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar37 + lVar19 * 4) =
                       pfVar36[lVar19] * *(float *)(*pauVar34 + lVar19 * 4);
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar36 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    auVar65 = *pauVar34;
                    fVar40 = *pfVar36;
                    auVar72._0_4_ = fVar40 * auVar65._0_4_;
                    auVar72._4_4_ = fVar40 * auVar65._4_4_;
                    auVar72._8_4_ = fVar40 * auVar65._8_4_;
                    auVar72._12_4_ = fVar40 * auVar65._12_4_;
                    *pauVar37 = auVar72;
                    pauVar34 = pauVar34 + 1;
                    pfVar36 = pfVar36 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar37 + lVar19 * 4) =
                         pfVar36[lVar19] * *(float *)(*pauVar34 + lVar19 * 4);
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 3:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  auVar65 = *pauVar34;
                  fVar40 = 1.0 / *pfVar36;
                  auVar79._0_4_ = fVar40 * auVar65._0_4_;
                  auVar79._4_4_ = fVar40 * auVar65._4_4_;
                  auVar79._8_4_ = fVar40 * auVar65._8_4_;
                  auVar79._12_4_ = fVar40 * auVar65._12_4_;
                  *pauVar37 = auVar79;
                  pauVar34 = pauVar34 + 1;
                  pfVar36 = pfVar36 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar37 + lVar19 * 4) =
                       *(float *)(*pauVar34 + lVar19 * 4) / pfVar36[lVar19];
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar36 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    auVar65 = *pauVar34;
                    fVar40 = 1.0 / *pfVar36;
                    auVar81._0_4_ = fVar40 * auVar65._0_4_;
                    auVar81._4_4_ = fVar40 * auVar65._4_4_;
                    auVar81._8_4_ = fVar40 * auVar65._8_4_;
                    auVar81._12_4_ = fVar40 * auVar65._12_4_;
                    *pauVar37 = auVar81;
                    pauVar34 = pauVar34 + 1;
                    pfVar36 = pfVar36 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar37 + lVar19 * 4) =
                         *(float *)(*pauVar34 + lVar19 * 4) / pfVar36[lVar19];
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 4:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              puVar35 = (undefined4 *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  uVar1 = *puVar35;
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar65 = maxps(auVar67,*pauVar34);
                  *pauVar37 = auVar65;
                  pauVar34 = pauVar34 + 1;
                  puVar35 = puVar35 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = (float)puVar35[lVar19];
                  if ((float)puVar35[lVar19] <= *(float *)(*pauVar34 + lVar19 * 4)) {
                    fVar40 = *(float *)(*pauVar34 + lVar19 * 4);
                  }
                  *(float *)((long)*pauVar37 + lVar19 * 4) = fVar40;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                puVar35 = (undefined4 *)
                          ((long)b->data +
                          (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    uVar1 = *puVar35;
                    auVar71._4_4_ = uVar1;
                    auVar71._0_4_ = uVar1;
                    auVar71._8_4_ = uVar1;
                    auVar71._12_4_ = uVar1;
                    auVar65 = maxps(auVar71,*pauVar34);
                    *pauVar37 = auVar65;
                    pauVar34 = pauVar34 + 1;
                    puVar35 = puVar35 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    fVar40 = (float)puVar35[lVar19];
                    if ((float)puVar35[lVar19] <= *(float *)(*pauVar34 + lVar19 * 4)) {
                      fVar40 = *(float *)(*pauVar34 + lVar19 * 4);
                    }
                    *(float *)((long)*pauVar37 + lVar19 * 4) = fVar40;
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 5:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              puVar35 = (undefined4 *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  uVar1 = *puVar35;
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar65 = minps(auVar70,*pauVar34);
                  *pauVar37 = auVar65;
                  pauVar34 = pauVar34 + 1;
                  puVar35 = puVar35 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = (float)puVar35[lVar19];
                  if (*(float *)(*pauVar34 + lVar19 * 4) <= (float)puVar35[lVar19]) {
                    fVar40 = *(float *)(*pauVar34 + lVar19 * 4);
                  }
                  *(float *)((long)*pauVar37 + lVar19 * 4) = fVar40;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                puVar35 = (undefined4 *)
                          ((long)b->data +
                          (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    uVar1 = *puVar35;
                    auVar75._4_4_ = uVar1;
                    auVar75._0_4_ = uVar1;
                    auVar75._8_4_ = uVar1;
                    auVar75._12_4_ = uVar1;
                    auVar65 = minps(auVar75,*pauVar34);
                    *pauVar37 = auVar65;
                    pauVar34 = pauVar34 + 1;
                    puVar35 = puVar35 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    fVar40 = (float)puVar35[lVar19];
                    if (*(float *)(*pauVar34 + lVar19 * 4) <= (float)puVar35[lVar19]) {
                      fVar40 = *(float *)(*pauVar34 + lVar19 * 4);
                    }
                    *(float *)((long)*pauVar37 + lVar19 * 4) = fVar40;
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 6:
          iVar23 = m->elempack;
          uVar11 = m->h;
          iVar32 = m->d;
          uVar16 = m->c;
          uVar17 = (ulong)uVar16;
          if (uVar18 == 2) {
            uVar33 = 0;
            uVar14 = 0;
            if (0 < (int)uVar29) {
              uVar14 = uVar29;
            }
            uVar15 = 0;
            if (0 < (int)uVar11) {
              uVar15 = (ulong)uVar11;
            }
            for (; uVar33 != uVar15; uVar33 = uVar33 + 1) {
              pfVar21 = (float *)((long)m->w * uVar33 * m->elemsize + (long)m->data);
              pauVar34 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar18 = uVar14;
              if (iVar23 == 4) {
                while (uVar18 != 0) {
                  _b._0_8_ = *(undefined8 *)pfVar21;
                  _b._8_8_ = *(undefined8 *)(pfVar21 + 2);
                  _b_4[1] = *pfVar36;
                  _b_4[0] = _b_4[1];
                  _b_4[3] = _b_4[1];
                  _b_4[2] = _b_4[1];
                  afVar87 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                      ((binary_op_pow *)&op,&_b,&_b_4);
                  auVar47._0_8_ = afVar87._0_8_;
                  auVar47._8_8_ = extraout_XMM0_Qb_05;
                  *pauVar34 = auVar47;
                  pfVar21 = pfVar21 + 4;
                  pfVar36 = pfVar36 + 1;
                  pauVar34 = pauVar34 + 1;
                  uVar18 = uVar18 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar14 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = powf(pfVar21[lVar19],pfVar36[lVar19]);
                  *(float *)((long)*pauVar34 + lVar19 * 4) = fVar40;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar32; iVar13 = iVar13 + 1) {
              iVar12 = b->d + -1;
              if (iVar13 <= iVar12) {
                iVar12 = iVar13;
              }
              for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
                uVar14 = b->h - 1;
                if ((int)uVar16 <= (int)uVar14) {
                  uVar14 = uVar16;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar21 = (float *)((long)b->data +
                                   (int)uVar14 * lVar19 + (long)b->h * (long)iVar12 * lVar19);
                uVar14 = uVar29;
                if (iVar23 == 4) {
                  while (uVar14 != 0) {
                    _b._0_8_ = *(undefined8 *)pfVar36;
                    _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                    _b_4[1] = *pfVar21;
                    _b_4[0] = _b_4[1];
                    _b_4[3] = _b_4[1];
                    _b_4[2] = _b_4[1];
                    afVar87 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                        ((binary_op_pow *)&op,&_b,&_b_4);
                    auVar52._0_8_ = afVar87._0_8_;
                    auVar52._8_8_ = extraout_XMM0_Qb_09;
                    *pauVar34 = auVar52;
                    pfVar36 = pfVar36 + 4;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar14 = uVar14 - 1;
                  }
                }
                if (iVar23 == 1) {
                  lVar19 = 0;
                  for (lVar24 = 0; uVar29 != (uint)lVar24; lVar24 = lVar24 + 1) {
                    fVar40 = powf(pfVar36[lVar24],pfVar21[lVar24]);
                    *(float *)((long)*pauVar34 + lVar24 * 4) = fVar40;
                    lVar19 = lVar19 + -4;
                  }
                  pfVar36 = (float *)((long)pfVar36 - lVar19);
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar19);
                }
              }
            }
          }
          return 0;
        case 7:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  auVar65 = *pauVar34;
                  fVar40 = *pfVar36;
                  auVar69._0_4_ = fVar40 - auVar65._0_4_;
                  auVar69._4_4_ = fVar40 - auVar65._4_4_;
                  auVar69._8_4_ = fVar40 - auVar65._8_4_;
                  auVar69._12_4_ = fVar40 - auVar65._12_4_;
                  *pauVar37 = auVar69;
                  pauVar34 = pauVar34 + 1;
                  pfVar36 = pfVar36 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar37 + lVar19 * 4) =
                       pfVar36[lVar19] - *(float *)(*pauVar34 + lVar19 * 4);
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar36 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    auVar65 = *pauVar34;
                    fVar40 = *pfVar36;
                    auVar73._0_4_ = fVar40 - auVar65._0_4_;
                    auVar73._4_4_ = fVar40 - auVar65._4_4_;
                    auVar73._8_4_ = fVar40 - auVar65._8_4_;
                    auVar73._12_4_ = fVar40 - auVar65._12_4_;
                    *pauVar37 = auVar73;
                    pauVar34 = pauVar34 + 1;
                    pfVar36 = pfVar36 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar37 + lVar19 * 4) =
                         pfVar36[lVar19] - *(float *)(*pauVar34 + lVar19 * 4);
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 8:
          iVar23 = m->elempack;
          uVar11 = m->h;
          uVar16 = m->d;
          uVar14 = m->c;
          if (uVar18 == 2) {
            uVar17 = 0;
            uVar18 = 0;
            if (0 < (int)uVar29) {
              uVar18 = uVar29;
            }
            uVar33 = 0;
            if (0 < (int)uVar11) {
              uVar33 = (ulong)uVar11;
            }
            for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
              pauVar34 = (undefined1 (*) [16])((long)m->w * uVar17 * m->elemsize + (long)m->data);
              pauVar37 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar20 = uVar18;
              if (iVar23 == 4) {
                while (uVar20 != 0) {
                  auVar65 = *pauVar34;
                  in_XMM1 = rcpps(in_XMM1,auVar65);
                  fVar40 = *pfVar36;
                  fVar39 = fVar40 * in_XMM1._0_4_;
                  fVar84 = fVar40 * in_XMM1._4_4_;
                  fVar85 = fVar40 * in_XMM1._8_4_;
                  fVar86 = fVar40 * in_XMM1._12_4_;
                  auVar80._0_4_ = (fVar40 - auVar65._0_4_ * fVar39) * in_XMM1._0_4_ + fVar39;
                  auVar80._4_4_ = (fVar40 - auVar65._4_4_ * fVar84) * in_XMM1._4_4_ + fVar84;
                  auVar80._8_4_ = (fVar40 - auVar65._8_4_ * fVar85) * in_XMM1._8_4_ + fVar85;
                  auVar80._12_4_ = (fVar40 - auVar65._12_4_ * fVar86) * in_XMM1._12_4_ + fVar86;
                  *pauVar37 = auVar80;
                  pauVar34 = pauVar34 + 1;
                  pfVar36 = pfVar36 + 1;
                  pauVar37 = pauVar37 + 1;
                  uVar20 = uVar20 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar18 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  *(float *)((long)*pauVar37 + lVar19 * 4) =
                       pfVar36[lVar19] / *(float *)(*pauVar34 + lVar19 * 4);
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          uVar17 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar17 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar33 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar33 = 0;
          }
          for (uVar15 = 0; uVar15 != uVar33; uVar15 = uVar15 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar15 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar15 * pMVar2->elemsize + (long)pMVar2->data);
            for (uVar29 = 0; uVar29 != uVar16; uVar29 = uVar29 + 1) {
              uVar14 = b->d - 1;
              if ((int)uVar29 <= (int)uVar14) {
                uVar14 = uVar29;
              }
              for (uVar18 = 0; uVar18 != uVar11; uVar18 = uVar18 + 1) {
                uVar20 = b->h - 1;
                if ((int)uVar18 <= (int)uVar20) {
                  uVar20 = uVar18;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar36 = (float *)((long)b->data +
                                   (int)uVar20 * lVar19 + (long)b->h * (long)(int)uVar14 * lVar19);
                uVar22 = uVar17;
                if (iVar23 == 4) {
                  while ((int)uVar22 != 0) {
                    auVar65 = *pauVar34;
                    in_XMM1 = rcpps(in_XMM1,auVar65);
                    fVar40 = *pfVar36;
                    fVar39 = fVar40 * in_XMM1._0_4_;
                    fVar84 = fVar40 * in_XMM1._4_4_;
                    fVar85 = fVar40 * in_XMM1._8_4_;
                    fVar86 = fVar40 * in_XMM1._12_4_;
                    auVar82._0_4_ = (fVar40 - auVar65._0_4_ * fVar39) * in_XMM1._0_4_ + fVar39;
                    auVar82._4_4_ = (fVar40 - auVar65._4_4_ * fVar84) * in_XMM1._4_4_ + fVar84;
                    auVar82._8_4_ = (fVar40 - auVar65._8_4_ * fVar85) * in_XMM1._8_4_ + fVar85;
                    auVar82._12_4_ = (fVar40 - auVar65._12_4_ * fVar86) * in_XMM1._12_4_ + fVar86;
                    *pauVar37 = auVar82;
                    pauVar34 = pauVar34 + 1;
                    pfVar36 = pfVar36 + 1;
                    pauVar37 = pauVar37 + 1;
                    uVar22 = (ulong)((int)uVar22 - 1);
                  }
                }
                if (iVar23 == 1) {
                  lVar24 = 0;
                  for (lVar19 = 0; (int)uVar17 != (int)lVar19; lVar19 = lVar19 + 1) {
                    *(float *)((long)*pauVar37 + lVar19 * 4) =
                         pfVar36[lVar19] / *(float *)(*pauVar34 + lVar19 * 4);
                    lVar24 = lVar24 + -4;
                  }
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar24);
                  pauVar37 = (undefined1 (*) [16])((long)pauVar37 - lVar24);
                }
              }
            }
          }
          return 0;
        case 9:
          iVar23 = m->elempack;
          uVar11 = m->h;
          iVar32 = m->d;
          uVar16 = m->c;
          uVar17 = (ulong)uVar16;
          if (uVar18 == 2) {
            uVar33 = 0;
            uVar14 = 0;
            if (0 < (int)uVar29) {
              uVar14 = uVar29;
            }
            uVar15 = 0;
            if (0 < (int)uVar11) {
              uVar15 = (ulong)uVar11;
            }
            for (; uVar33 != uVar15; uVar33 = uVar33 + 1) {
              pfVar21 = (float *)((long)m->w * uVar33 * m->elemsize + (long)m->data);
              pauVar34 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar18 = uVar14;
              if (iVar23 == 4) {
                while (uVar18 != 0) {
                  _b._0_8_ = *(undefined8 *)pfVar21;
                  _b._8_8_ = *(undefined8 *)(pfVar21 + 2);
                  _b_4[1] = *pfVar36;
                  _b_4[0] = _b_4[1];
                  _b_4[3] = _b_4[1];
                  _b_4[2] = _b_4[1];
                  afVar87 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                      ((binary_op_rpow *)&op,&_b,&_b_4);
                  auVar45._0_8_ = afVar87._0_8_;
                  auVar45._8_8_ = extraout_XMM0_Qb_04;
                  *pauVar34 = auVar45;
                  pfVar21 = pfVar21 + 4;
                  pfVar36 = pfVar36 + 1;
                  pauVar34 = pauVar34 + 1;
                  uVar18 = uVar18 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar14 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = powf(pfVar36[lVar19],pfVar21[lVar19]);
                  *(float *)((long)*pauVar34 + lVar19 * 4) = fVar40;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar32; iVar13 = iVar13 + 1) {
              iVar12 = b->d + -1;
              if (iVar13 <= iVar12) {
                iVar12 = iVar13;
              }
              for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
                uVar14 = b->h - 1;
                if ((int)uVar16 <= (int)uVar14) {
                  uVar14 = uVar16;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar21 = (float *)((long)b->data +
                                   (int)uVar14 * lVar19 + (long)b->h * (long)iVar12 * lVar19);
                uVar14 = uVar29;
                if (iVar23 == 4) {
                  while (uVar14 != 0) {
                    _b._0_8_ = *(undefined8 *)pfVar36;
                    _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                    _b_4[1] = *pfVar21;
                    _b_4[0] = _b_4[1];
                    _b_4[3] = _b_4[1];
                    _b_4[2] = _b_4[1];
                    afVar87 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                        ((binary_op_rpow *)&op,&_b,&_b_4);
                    auVar50._0_8_ = afVar87._0_8_;
                    auVar50._8_8_ = extraout_XMM0_Qb_08;
                    *pauVar34 = auVar50;
                    pfVar36 = pfVar36 + 4;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = pauVar34 + 1;
                    uVar14 = uVar14 - 1;
                  }
                }
                if (iVar23 == 1) {
                  lVar19 = 0;
                  for (lVar24 = 0; uVar29 != (uint)lVar24; lVar24 = lVar24 + 1) {
                    fVar40 = powf(pfVar21[lVar24],pfVar36[lVar24]);
                    *(float *)((long)*pauVar34 + lVar24 * 4) = fVar40;
                    lVar19 = lVar19 + -4;
                  }
                  pfVar36 = (float *)((long)pfVar36 - lVar19);
                  pauVar34 = (undefined1 (*) [16])((long)pauVar34 - lVar19);
                }
              }
            }
          }
          return 0;
        case 10:
          iVar23 = m->elempack;
          uVar11 = m->h;
          iVar32 = m->d;
          uVar16 = m->c;
          uVar17 = (ulong)uVar16;
          if (uVar18 == 2) {
            uVar33 = 0;
            uVar14 = 0;
            if (0 < (int)uVar29) {
              uVar14 = uVar29;
            }
            uVar15 = 0;
            if (0 < (int)uVar11) {
              uVar15 = (ulong)uVar11;
            }
            for (; uVar33 != uVar15; uVar33 = uVar33 + 1) {
              pfVar21 = (float *)((long)m->w * uVar33 * m->elemsize + (long)m->data);
              pauVar34 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar18 = uVar14;
              if (iVar23 == 4) {
                while (uVar18 != 0) {
                  _b._0_8_ = *(undefined8 *)pfVar21;
                  _b._8_8_ = *(undefined8 *)(pfVar21 + 2);
                  _b_4[1] = *pfVar36;
                  _b_4[0] = _b_4[1];
                  _b_4[3] = _b_4[1];
                  _b_4[2] = _b_4[1];
                  afVar87 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                      ((binary_op_atan2 *)&op,&_b,&_b_4);
                  auVar48._0_8_ = afVar87._0_8_;
                  auVar48._8_8_ = extraout_XMM0_Qb_06;
                  *pauVar34 = auVar48;
                  pfVar21 = pfVar21 + 4;
                  pfVar36 = pfVar36 + 1;
                  pauVar34 = pauVar34 + 1;
                  uVar18 = uVar18 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar14 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = BinaryOp_x86_functor::binary_op_atan2::func
                                     ((binary_op_atan2 *)&op,pfVar21,pfVar36);
                  *(float *)((long)*pauVar34 + lVar19 * 4) = fVar40;
                  pfVar21 = pfVar21 + 1;
                  pfVar36 = pfVar36 + 1;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar32; iVar13 = iVar13 + 1) {
              iVar12 = b->d + -1;
              if (iVar13 <= iVar12) {
                iVar12 = iVar13;
              }
              for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
                uVar14 = b->h - 1;
                if ((int)uVar16 <= (int)uVar14) {
                  uVar14 = uVar16;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar21 = (float *)((long)b->data +
                                   (int)uVar14 * lVar19 + (long)b->h * (long)iVar12 * lVar19);
                uVar14 = uVar29;
                if (iVar23 == 4) {
                  while (bVar38 = uVar14 != 0, uVar14 = uVar14 - 1, bVar38) {
                    _b._0_8_ = *(undefined8 *)pfVar36;
                    _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                    _b_4[1] = *pfVar21;
                    _b_4[0] = _b_4[1];
                    _b_4[3] = _b_4[1];
                    _b_4[2] = _b_4[1];
                    afVar87 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                        ((binary_op_atan2 *)&op,&_b,&_b_4);
                    auVar53._0_8_ = afVar87._0_8_;
                    auVar53._8_8_ = extraout_XMM0_Qb_10;
                    *pauVar34 = auVar53;
                    pfVar36 = pfVar36 + 4;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = pauVar34 + 1;
                  }
                }
                uVar14 = uVar29;
                if (iVar23 == 1) {
                  while (bVar38 = uVar14 != 0, uVar14 = uVar14 - 1, bVar38) {
                    fVar40 = BinaryOp_x86_functor::binary_op_atan2::func
                                       ((binary_op_atan2 *)&op,pfVar36,pfVar21);
                    *(float *)*pauVar34 = fVar40;
                    pfVar36 = pfVar36 + 1;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
                  }
                }
              }
            }
          }
          return 0;
        case 0xb:
          iVar23 = m->elempack;
          uVar11 = m->h;
          iVar32 = m->d;
          uVar16 = m->c;
          uVar17 = (ulong)uVar16;
          if (uVar18 == 2) {
            uVar33 = 0;
            uVar14 = 0;
            if (0 < (int)uVar29) {
              uVar14 = uVar29;
            }
            uVar15 = 0;
            if (0 < (int)uVar11) {
              uVar15 = (ulong)uVar11;
            }
            for (; uVar33 != uVar15; uVar33 = uVar33 + 1) {
              pfVar21 = (float *)((long)m->w * uVar33 * m->elemsize + (long)m->data);
              pauVar34 = (undefined1 (*) [16])
                         ((long)pMVar2->w * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
              pfVar36 = (float *)b->data;
              uVar18 = uVar14;
              if (iVar23 == 4) {
                while (uVar18 != 0) {
                  _b._0_8_ = *(undefined8 *)pfVar21;
                  _b._8_8_ = *(undefined8 *)(pfVar21 + 2);
                  _b_4[1] = *pfVar36;
                  _b_4[0] = _b_4[1];
                  _b_4[3] = _b_4[1];
                  _b_4[2] = _b_4[1];
                  afVar87 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4(&op,&_b,&_b_4);
                  auVar44._0_8_ = afVar87._0_8_;
                  auVar44._8_8_ = extraout_XMM0_Qb_03;
                  *pauVar34 = auVar44;
                  pfVar21 = pfVar21 + 4;
                  pfVar36 = pfVar36 + 1;
                  pauVar34 = pauVar34 + 1;
                  uVar18 = uVar18 - 1;
                }
              }
              if (iVar23 == 1) {
                for (lVar19 = 0; uVar14 != (uint)lVar19; lVar19 = lVar19 + 1) {
                  fVar40 = BinaryOp_x86_functor::binary_op_ratan2::func(&op,pfVar21,pfVar36);
                  *(float *)((long)*pauVar34 + lVar19 * 4) = fVar40;
                  pfVar21 = pfVar21 + 1;
                  pfVar36 = pfVar36 + 1;
                }
              }
            }
            uVar18 = m->dims;
          }
          if (1 < uVar18 - 3) {
            return 0;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar32; iVar13 = iVar13 + 1) {
              iVar12 = b->d + -1;
              if (iVar13 <= iVar12) {
                iVar12 = iVar13;
              }
              for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
                uVar14 = b->h - 1;
                if ((int)uVar16 <= (int)uVar14) {
                  uVar14 = uVar16;
                }
                lVar19 = (long)b->w * b->elemsize;
                pfVar21 = (float *)((long)b->data +
                                   (int)uVar14 * lVar19 + (long)b->h * (long)iVar12 * lVar19);
                uVar14 = uVar29;
                if (iVar23 == 4) {
                  while (bVar38 = uVar14 != 0, uVar14 = uVar14 - 1, bVar38) {
                    _b._0_8_ = *(undefined8 *)pfVar36;
                    _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                    _b_4[1] = *pfVar21;
                    _b_4[0] = _b_4[1];
                    _b_4[3] = _b_4[1];
                    _b_4[2] = _b_4[1];
                    afVar87 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4(&op,&_b,&_b_4);
                    auVar49._0_8_ = afVar87._0_8_;
                    auVar49._8_8_ = extraout_XMM0_Qb_07;
                    *pauVar34 = auVar49;
                    pfVar36 = pfVar36 + 4;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = pauVar34 + 1;
                  }
                }
                uVar14 = uVar29;
                if (iVar23 == 1) {
                  while (bVar38 = uVar14 != 0, uVar14 = uVar14 - 1, bVar38) {
                    fVar40 = BinaryOp_x86_functor::binary_op_ratan2::func(&op,pfVar36,pfVar21);
                    *(float *)*pauVar34 = fVar40;
                    pfVar36 = pfVar36 + 1;
                    pfVar21 = pfVar21 + 1;
                    pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
                  }
                }
              }
            }
          }
          return 0;
        }
      }
      else if ((bVar10 && uVar20 == 3) && (iVar32 == 1)) {
        if (m->w != uVar29) {
          return 0;
        }
        if (m->c != uVar16) {
          return 0;
        }
        switch(uVar11) {
        case 0:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pfVar36 = (float *)((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar34;
                auVar66._0_4_ = *pfVar36 + auVar65._0_4_;
                auVar66._4_4_ = pfVar36[1] + auVar65._4_4_;
                auVar66._8_4_ = pfVar36[2] + auVar65._8_4_;
                auVar66._12_4_ = pfVar36[3] + auVar65._12_4_;
                *pauVar37 = auVar66;
                pauVar34 = pauVar34 + 1;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar37 =
                     *(float *)((long)pvVar3 + lVar19 * 4 + lVar24) + *(float *)*pauVar34;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 1:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pauVar37 = (undefined1 (*) [16])((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar37;
                auVar57._0_4_ = *pfVar36 - auVar65._0_4_;
                auVar57._4_4_ = pfVar36[1] - auVar65._4_4_;
                auVar57._8_4_ = pfVar36[2] - auVar65._8_4_;
                auVar57._12_4_ = pfVar36[3] - auVar65._12_4_;
                *pauVar34 = auVar57;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                pauVar34 = pauVar34 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar34 = *pfVar36 - *(float *)((long)pvVar3 + lVar19 * 4 + lVar24);
                pfVar36 = pfVar36 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          return 0;
        case 2:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pfVar36 = (float *)((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar34;
                auVar76._0_4_ = *pfVar36 * auVar65._0_4_;
                auVar76._4_4_ = pfVar36[1] * auVar65._4_4_;
                auVar76._8_4_ = pfVar36[2] * auVar65._8_4_;
                auVar76._12_4_ = pfVar36[3] * auVar65._12_4_;
                *pauVar37 = auVar76;
                pauVar34 = pauVar34 + 1;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar37 =
                     *(float *)((long)pvVar3 + lVar19 * 4 + lVar24) * *(float *)*pauVar34;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 3:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pauVar37 = (undefined1 (*) [16])((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar37;
                in_XMM2 = rcpps(in_XMM2,auVar65);
                fVar40 = *pfVar36 * in_XMM2._0_4_;
                fVar39 = pfVar36[1] * in_XMM2._4_4_;
                fVar84 = pfVar36[2] * in_XMM2._8_4_;
                fVar85 = pfVar36[3] * in_XMM2._12_4_;
                auVar56._0_4_ = (*pfVar36 - auVar65._0_4_ * fVar40) * in_XMM2._0_4_ + fVar40;
                auVar56._4_4_ = (pfVar36[1] - auVar65._4_4_ * fVar39) * in_XMM2._4_4_ + fVar39;
                auVar56._8_4_ = (pfVar36[2] - auVar65._8_4_ * fVar84) * in_XMM2._8_4_ + fVar84;
                auVar56._12_4_ = (pfVar36[3] - auVar65._12_4_ * fVar85) * in_XMM2._12_4_ + fVar85;
                *pauVar34 = auVar56;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                pauVar34 = pauVar34 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar34 = *pfVar36 / *(float *)((long)pvVar3 + lVar19 * 4 + lVar24);
                pfVar36 = pfVar36 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          return 0;
        case 4:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pauVar30 = (undefined1 (*) [16])((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = maxps(*pauVar30,*pauVar34);
                *pauVar37 = auVar65;
                pauVar34 = pauVar34 + 1;
                pauVar30 = pauVar30 + 1;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                fVar40 = *(float *)((long)pvVar3 + lVar19 * 4 + lVar24);
                if (fVar40 <= *(float *)*pauVar34) {
                  fVar40 = *(float *)*pauVar34;
                }
                *(float *)*pauVar37 = fVar40;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 5:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pauVar30 = (undefined1 (*) [16])((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = minps(*pauVar30,*pauVar34);
                *pauVar37 = auVar65;
                pauVar34 = pauVar34 + 1;
                pauVar30 = pauVar30 + 1;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                fVar40 = *(float *)((long)pvVar3 + lVar19 * 4 + lVar24);
                if (*(float *)*pauVar34 <= fVar40) {
                  fVar40 = *(float *)*pauVar34;
                }
                *(float *)*pauVar37 = fVar40;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 6:
          iVar23 = m->h;
          iVar32 = uVar29 * m->elempack;
          uVar17 = 0;
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          uVar33 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar33 = uVar17;
          }
          for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
            pfVar36 = (float *)(m->cstep * uVar17 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar19 = b->cstep * uVar17 * b->elemsize;
              pvVar3 = b->data;
              pfVar21 = (float *)((long)pvVar3 + lVar19);
              lVar24 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                _b._0_8_ = *(undefined8 *)pfVar36;
                _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                _b_4._0_8_ = *(undefined8 *)pfVar21;
                _b_4._8_8_ = *(undefined8 *)(pfVar21 + 2);
                afVar87 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                                    ((binary_op_pow *)&op,&_b,&_b_4);
                auVar58._0_8_ = afVar87._0_8_;
                auVar58._8_8_ = extraout_XMM0_Qb_13;
                *pauVar34 = auVar58;
                pfVar36 = pfVar36 + 4;
                pfVar21 = pfVar21 + 4;
                pauVar34 = pauVar34 + 1;
                lVar24 = lVar24 + 4;
              }
              for (; (int)lVar24 < iVar32; lVar24 = lVar24 + 1) {
                fVar40 = powf(*pfVar36,*(float *)((long)pvVar3 + lVar24 * 4 + lVar19));
                *(float *)*pauVar34 = fVar40;
                pfVar36 = pfVar36 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          break;
        case 7:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pfVar36 = (float *)((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar34;
                auVar77._0_4_ = *pfVar36 - auVar65._0_4_;
                auVar77._4_4_ = pfVar36[1] - auVar65._4_4_;
                auVar77._8_4_ = pfVar36[2] - auVar65._8_4_;
                auVar77._12_4_ = pfVar36[3] - auVar65._12_4_;
                *pauVar37 = auVar77;
                pauVar34 = pauVar34 + 1;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar37 =
                     *(float *)((long)pvVar3 + lVar19 * 4 + lVar24) - *(float *)*pauVar34;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 8:
          iVar32 = uVar29 * m->elempack;
          iVar23 = m->h;
          if (m->h < 1) {
            iVar23 = 0;
          }
          uVar17 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar17 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar17; uVar33 = uVar33 + 1) {
            pauVar34 = (undefined1 (*) [16])(m->cstep * uVar33 * m->elemsize + (long)m->data);
            pauVar37 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar33 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar24 = b->cstep * uVar33 * b->elemsize;
              pvVar3 = b->data;
              pfVar36 = (float *)((long)pvVar3 + lVar24);
              lVar19 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                auVar65 = *pauVar34;
                in_XMM1 = rcpps(in_XMM1,auVar65);
                fVar40 = *pfVar36 * in_XMM1._0_4_;
                fVar39 = pfVar36[1] * in_XMM1._4_4_;
                fVar84 = pfVar36[2] * in_XMM1._8_4_;
                fVar85 = pfVar36[3] * in_XMM1._12_4_;
                auVar83._0_4_ = (*pfVar36 - auVar65._0_4_ * fVar40) * in_XMM1._0_4_ + fVar40;
                auVar83._4_4_ = (pfVar36[1] - auVar65._4_4_ * fVar39) * in_XMM1._4_4_ + fVar39;
                auVar83._8_4_ = (pfVar36[2] - auVar65._8_4_ * fVar84) * in_XMM1._8_4_ + fVar84;
                auVar83._12_4_ = (pfVar36[3] - auVar65._12_4_ * fVar85) * in_XMM1._12_4_ + fVar85;
                *pauVar37 = auVar83;
                pauVar34 = pauVar34 + 1;
                pfVar36 = pfVar36 + 4;
                pauVar37 = pauVar37 + 1;
                lVar19 = lVar19 + 4;
              }
              for (; (int)lVar19 < iVar32; lVar19 = lVar19 + 1) {
                *(float *)*pauVar37 =
                     *(float *)((long)pvVar3 + lVar19 * 4 + lVar24) / *(float *)*pauVar34;
                pauVar34 = (undefined1 (*) [16])(*pauVar34 + 4);
                pauVar37 = (undefined1 (*) [16])((long)*pauVar37 + 4);
              }
            }
          }
          return 0;
        case 9:
          iVar23 = m->h;
          iVar32 = uVar29 * m->elempack;
          uVar17 = 0;
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          uVar33 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar33 = uVar17;
          }
          for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
            pfVar36 = (float *)(m->cstep * uVar17 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              lVar19 = b->cstep * uVar17 * b->elemsize;
              pvVar3 = b->data;
              pfVar21 = (float *)((long)pvVar3 + lVar19);
              lVar24 = 0;
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                _b._0_8_ = *(undefined8 *)pfVar36;
                _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                _b_4._0_8_ = *(undefined8 *)pfVar21;
                _b_4._8_8_ = *(undefined8 *)(pfVar21 + 2);
                afVar87 = BinaryOp_x86_functor::binary_op_rpow::func_pack4
                                    ((binary_op_rpow *)&op,&_b,&_b_4);
                auVar55._0_8_ = afVar87._0_8_;
                auVar55._8_8_ = extraout_XMM0_Qb_12;
                *pauVar34 = auVar55;
                pfVar36 = pfVar36 + 4;
                pfVar21 = pfVar21 + 4;
                pauVar34 = pauVar34 + 1;
                lVar24 = lVar24 + 4;
              }
              for (; (int)lVar24 < iVar32; lVar24 = lVar24 + 1) {
                fVar40 = powf(*(float *)((long)pvVar3 + lVar24 * 4 + lVar19),*pfVar36);
                *(float *)*pauVar34 = fVar40;
                pfVar36 = pfVar36 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          break;
        case 10:
          iVar23 = m->h;
          iVar32 = uVar29 * m->elempack;
          uVar17 = 0;
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          uVar33 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar33 = uVar17;
          }
          for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
            pfVar36 = (float *)(m->cstep * uVar17 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              pfVar21 = (float *)(b->cstep * uVar17 * b->elemsize + (long)b->data);
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                _b._0_8_ = *(undefined8 *)pfVar36;
                _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                _b_4._0_8_ = *(undefined8 *)pfVar21;
                _b_4._8_8_ = *(undefined8 *)(pfVar21 + 2);
                afVar87 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                                    ((binary_op_atan2 *)&op,&_b,&_b_4);
                auVar59._0_8_ = afVar87._0_8_;
                auVar59._8_8_ = extraout_XMM0_Qb_14;
                *pauVar34 = auVar59;
                pfVar36 = pfVar36 + 4;
                pfVar21 = pfVar21 + 4;
                pauVar34 = pauVar34 + 1;
              }
              for (; iVar12 < iVar32; iVar12 = iVar12 + 1) {
                fVar40 = BinaryOp_x86_functor::binary_op_atan2::func
                                   ((binary_op_atan2 *)&op,pfVar36,pfVar21);
                *(float *)*pauVar34 = fVar40;
                pfVar36 = pfVar36 + 1;
                pfVar21 = pfVar21 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          break;
        case 0xb:
          iVar23 = m->h;
          iVar32 = uVar29 * m->elempack;
          uVar17 = 0;
          if (iVar23 < 1) {
            iVar23 = 0;
          }
          uVar33 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar33 = uVar17;
          }
          for (; uVar17 != uVar33; uVar17 = uVar17 + 1) {
            pfVar36 = (float *)(m->cstep * uVar17 * m->elemsize + (long)m->data);
            pauVar34 = (undefined1 (*) [16])
                       (pMVar2->cstep * uVar17 * pMVar2->elemsize + (long)pMVar2->data);
            for (iVar13 = 0; iVar13 != iVar23; iVar13 = iVar13 + 1) {
              pfVar21 = (float *)(b->cstep * uVar17 * b->elemsize + (long)b->data);
              for (iVar12 = 0; iVar12 + 3 < iVar32; iVar12 = iVar12 + 4) {
                _b._0_8_ = *(undefined8 *)pfVar36;
                _b._8_8_ = *(undefined8 *)(pfVar36 + 2);
                _b_4._0_8_ = *(undefined8 *)pfVar21;
                _b_4._8_8_ = *(undefined8 *)(pfVar21 + 2);
                afVar87 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4(&op,&_b,&_b_4);
                auVar54._0_8_ = afVar87._0_8_;
                auVar54._8_8_ = extraout_XMM0_Qb_11;
                *pauVar34 = auVar54;
                pfVar36 = pfVar36 + 4;
                pfVar21 = pfVar21 + 4;
                pauVar34 = pauVar34 + 1;
              }
              for (; iVar12 < iVar32; iVar12 = iVar12 + 1) {
                fVar40 = BinaryOp_x86_functor::binary_op_ratan2::func(&op,pfVar36,pfVar21);
                *(float *)*pauVar34 = fVar40;
                pfVar36 = pfVar36 + 1;
                pfVar21 = pfVar21 + 1;
                pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 4);
              }
            }
          }
          break;
        default:
          return 0;
        }
      }
      goto switchD_00345174_default;
    }
    switch(uVar11) {
    case 0:
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        lVar19 = m->elemsize * m->cstep * uVar17;
        pvVar3 = m->data;
        lVar24 = b->elemsize * b->cstep * uVar17;
        pvVar6 = b->data;
        lVar26 = pMVar2->elemsize * pMVar2->cstep * uVar17;
        pvVar9 = pMVar2->data;
        lVar27 = 0;
        lVar28 = 0;
        for (iVar32 = 0; iVar32 + 3 < (int)(uVar14 * iVar23); iVar32 = iVar32 + 4) {
          pfVar36 = (float *)((long)pvVar6 + lVar28 + lVar24);
          pfVar21 = (float *)((long)pvVar3 + lVar28 + lVar19);
          auVar41._0_4_ = *pfVar36 + *pfVar21;
          auVar41._4_4_ = pfVar36[1] + pfVar21[1];
          auVar41._8_4_ = pfVar36[2] + pfVar21[2];
          auVar41._12_4_ = pfVar36[3] + pfVar21[3];
          *(undefined1 (*) [16])((long)pvVar9 + lVar28 + lVar26) = auVar41;
          lVar28 = lVar28 + 0x10;
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < (int)(uVar14 * iVar23); lVar27 = lVar27 + 1) {
          *(float *)((long)pvVar9 + lVar27 * 4 + lVar26) =
               *(float *)((long)pvVar6 + lVar27 * 4 + lVar24) +
               *(float *)((long)pvVar3 + lVar27 * 4 + lVar19);
        }
      }
      return 0;
    case 1:
      pMVar25 = b;
      break;
    case 2:
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        lVar19 = m->elemsize * m->cstep * uVar17;
        pvVar3 = m->data;
        lVar24 = b->elemsize * b->cstep * uVar17;
        pvVar6 = b->data;
        lVar26 = pMVar2->elemsize * pMVar2->cstep * uVar17;
        pvVar9 = pMVar2->data;
        lVar27 = 0;
        lVar28 = 0;
        for (iVar32 = 0; iVar32 + 3 < (int)(uVar14 * iVar23); iVar32 = iVar32 + 4) {
          pfVar36 = (float *)((long)pvVar6 + lVar28 + lVar24);
          pfVar21 = (float *)((long)pvVar3 + lVar28 + lVar19);
          auVar65._0_4_ = *pfVar36 * *pfVar21;
          auVar65._4_4_ = pfVar36[1] * pfVar21[1];
          auVar65._8_4_ = pfVar36[2] * pfVar21[2];
          auVar65._12_4_ = pfVar36[3] * pfVar21[3];
          *(undefined1 (*) [16])((long)pvVar9 + lVar28 + lVar26) = auVar65;
          lVar28 = lVar28 + 0x10;
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < (int)(uVar14 * iVar23); lVar27 = lVar27 + 1) {
          *(float *)((long)pvVar9 + lVar27 * 4 + lVar26) =
               *(float *)((long)pvVar6 + lVar27 * 4 + lVar24) *
               *(float *)((long)pvVar3 + lVar27 * 4 + lVar19);
        }
      }
      return 0;
    case 3:
      pMVar25 = b;
      goto LAB_00348a89;
    case 4:
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        lVar19 = m->elemsize * m->cstep * uVar17;
        pvVar3 = m->data;
        lVar24 = b->elemsize * b->cstep * uVar17;
        pvVar6 = b->data;
        lVar26 = pMVar2->elemsize * pMVar2->cstep * uVar17;
        pvVar9 = pMVar2->data;
        lVar27 = 0;
        lVar28 = 0;
        for (iVar32 = 0; iVar32 + 3 < (int)(uVar14 * iVar23); iVar32 = iVar32 + 4) {
          auVar65 = maxps(*(undefined1 (*) [16])((long)pvVar3 + lVar28 + lVar19),
                          *(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar24));
          *(undefined1 (*) [16])((long)pvVar9 + lVar28 + lVar26) = auVar65;
          lVar28 = lVar28 + 0x10;
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < (int)(uVar14 * iVar23); lVar27 = lVar27 + 1) {
          fVar39 = *(float *)((long)pvVar6 + lVar27 * 4 + lVar24);
          fVar40 = *(float *)((long)pvVar3 + lVar27 * 4 + lVar19);
          if (fVar39 <= fVar40) {
            fVar39 = fVar40;
          }
          *(float *)((long)pvVar9 + lVar27 * 4 + lVar26) = fVar39;
        }
      }
      return 0;
    case 5:
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        lVar19 = m->elemsize * m->cstep * uVar17;
        pvVar3 = m->data;
        lVar24 = b->elemsize * b->cstep * uVar17;
        pvVar6 = b->data;
        lVar26 = pMVar2->elemsize * pMVar2->cstep * uVar17;
        pvVar9 = pMVar2->data;
        lVar27 = 0;
        lVar28 = 0;
        for (iVar32 = 0; iVar32 + 3 < (int)(uVar14 * iVar23); iVar32 = iVar32 + 4) {
          auVar65 = minps(*(undefined1 (*) [16])((long)pvVar3 + lVar28 + lVar19),
                          *(undefined1 (*) [16])((long)pvVar6 + lVar28 + lVar24));
          *(undefined1 (*) [16])((long)pvVar9 + lVar28 + lVar26) = auVar65;
          lVar28 = lVar28 + 0x10;
          lVar27 = lVar27 + 4;
        }
        for (; (int)lVar27 < (int)(uVar14 * iVar23); lVar27 = lVar27 + 1) {
          fVar39 = *(float *)((long)pvVar6 + lVar27 * 4 + lVar24);
          fVar40 = *(float *)((long)pvVar3 + lVar27 * 4 + lVar19);
          if (fVar40 <= fVar39) {
            fVar39 = fVar40;
          }
          *(float *)((long)pvVar9 + lVar27 * 4 + lVar26) = fVar39;
        }
      }
      return 0;
    case 6:
      pMVar25 = b;
      goto LAB_00348a6b;
    case 7:
      pMVar25 = m;
      m = b;
      break;
    case 8:
      pMVar25 = m;
      m = b;
LAB_00348a89:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_div>(m,pMVar25,pMVar2,opt_00);
      return 0;
    case 9:
      pMVar25 = m;
      m = b;
LAB_00348a6b:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_pow>(m,pMVar25,pMVar2,opt_00);
      return 0;
    case 10:
      pMVar25 = b;
      goto LAB_00348aa7;
    case 0xb:
      pMVar25 = m;
      m = b;
LAB_00348aa7:
      binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_atan2>(m,pMVar25,pMVar2,opt_00);
      return 0;
    default:
      goto switchD_00345174_default;
    }
    binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_sub>(m,pMVar25,pMVar2,opt_00);
    return 0;
  }
  if (0xb < uVar11) goto switchD_00345174_default;
  fVar40 = *b->data;
  switch(uVar11) {
  case 0:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar60._0_4_ = *pfVar36 + fVar40;
        auVar60._4_4_ = pfVar36[1] + fVar40;
        auVar60._8_4_ = pfVar36[2] + fVar40;
        auVar60._12_4_ = pfVar36[3] + fVar40;
        *pauVar34 = auVar60;
        pfVar36 = pfVar36 + 4;
        pauVar34 = pauVar34 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17) + fVar40;
      }
    }
    break;
  case 1:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar64._0_4_ = *pfVar36 - fVar40;
        auVar64._4_4_ = pfVar36[1] - fVar40;
        auVar64._8_4_ = pfVar36[2] - fVar40;
        auVar64._12_4_ = pfVar36[3] - fVar40;
        *pauVar34 = auVar64;
        pfVar36 = pfVar36 + 4;
        pauVar34 = pauVar34 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17) - fVar40;
      }
    }
    break;
  case 2:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar62._0_4_ = *pfVar36 * fVar40;
        auVar62._4_4_ = pfVar36[1] * fVar40;
        auVar62._8_4_ = pfVar36[2] * fVar40;
        auVar62._12_4_ = pfVar36[3] * fVar40;
        *pauVar34 = auVar62;
        pfVar36 = pfVar36 + 4;
        pauVar34 = pauVar34 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17) * fVar40;
      }
    }
    break;
  case 3:
    iVar23 = m->h * m->w * m->d * m->elempack;
    fVar40 = 1.0 / fVar40;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar78._0_4_ = *pfVar36 * fVar40;
        auVar78._4_4_ = pfVar36[1] * fVar40;
        auVar78._8_4_ = pfVar36[2] * fVar40;
        auVar78._12_4_ = pfVar36[3] * fVar40;
        *pauVar34 = auVar78;
        pfVar36 = pfVar36 + 4;
        pauVar34 = pauVar34 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17) * fVar40;
      }
    }
    break;
  case 4:
    iVar23 = m->h * m->w * m->d * m->elempack;
    auVar42._4_4_ = fVar40;
    auVar42._0_4_ = fVar40;
    auVar42._8_4_ = fVar40;
    auVar42._12_4_ = fVar40;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar37 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar65 = maxps(*pauVar34,auVar42);
        *pauVar37 = auVar65;
        pauVar34 = pauVar34 + 1;
        pauVar37 = pauVar37 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17);
        if (fVar39 <= fVar40) {
          fVar39 = fVar40;
        }
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) = fVar39;
      }
    }
    break;
  case 5:
    iVar23 = m->h * m->w * m->d * m->elempack;
    auVar43._4_4_ = fVar40;
    auVar43._0_4_ = fVar40;
    auVar43._8_4_ = fVar40;
    auVar43._12_4_ = fVar40;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar37 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar65 = minps(*pauVar34,auVar43);
        *pauVar37 = auVar65;
        pauVar34 = pauVar34 + 1;
        pauVar37 = pauVar37 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17);
        if (fVar40 <= fVar39) {
          fVar39 = fVar40;
        }
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) = fVar39;
      }
    }
    break;
  case 6:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar33 = 0;
    uVar17 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar17 = uVar33;
    }
    for (; uVar33 != uVar17; uVar33 = uVar33 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar33 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      puVar31 = (undefined8 *)(sVar8 * uVar33 * sVar7 + (long)pvVar6);
      _b[3] = fVar40;
      _b[2] = fVar40;
      _b[0] = fVar40;
      _b[1] = fVar40;
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        _b_4._0_8_ = *(undefined8 *)pfVar36;
        _b_4._8_8_ = *(undefined8 *)(pfVar36 + 2);
        afVar87 = BinaryOp_x86_functor::binary_op_pow::func_pack4((binary_op_pow *)&op,&_b_4,&_b);
        *puVar31 = afVar87._0_8_;
        puVar31[1] = extraout_XMM0_Qb_01;
        pfVar36 = pfVar36 + 4;
        puVar31 = puVar31 + 2;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = powf(*(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar33),fVar40);
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar33) = fVar39;
      }
    }
    goto switchD_00345174_default;
  case 7:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar63._0_4_ = fVar40 - *pfVar36;
        auVar63._4_4_ = fVar40 - pfVar36[1];
        auVar63._8_4_ = fVar40 - pfVar36[2];
        auVar63._12_4_ = fVar40 - pfVar36[3];
        *pauVar34 = auVar63;
        pfVar36 = pfVar36 + 4;
        pauVar34 = pauVar34 + 1;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             fVar40 - *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17);
      }
    }
    break;
  case 8:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar11 = m->c;
    if (m->c < 1) {
      uVar11 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pauVar34 = (undefined1 (*) [16])(sVar5 * uVar17 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      pfVar36 = (float *)(sVar8 * uVar17 * sVar7 + (long)pvVar6);
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        auVar65 = *pauVar34;
        in_XMM2 = rcpps(in_XMM2,auVar65);
        fVar39 = fVar40 * in_XMM2._0_4_;
        fVar84 = fVar40 * in_XMM2._4_4_;
        fVar85 = fVar40 * in_XMM2._8_4_;
        fVar86 = fVar40 * in_XMM2._12_4_;
        *pfVar36 = (fVar40 - auVar65._0_4_ * fVar39) * in_XMM2._0_4_ + fVar39;
        pfVar36[1] = (fVar40 - auVar65._4_4_ * fVar84) * in_XMM2._4_4_ + fVar84;
        pfVar36[2] = (fVar40 - auVar65._8_4_ * fVar85) * in_XMM2._8_4_ + fVar85;
        pfVar36[3] = (fVar40 - auVar65._12_4_ * fVar86) * in_XMM2._12_4_ + fVar86;
        pauVar34 = pauVar34 + 1;
        pfVar36 = pfVar36 + 4;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar17) =
             fVar40 / *(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar17);
      }
    }
    break;
  case 9:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar33 = 0;
    uVar17 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar17 = uVar33;
    }
    for (; uVar33 != uVar17; uVar33 = uVar33 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar33 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      puVar31 = (undefined8 *)(sVar8 * uVar33 * sVar7 + (long)pvVar6);
      _b[3] = fVar40;
      _b[2] = fVar40;
      _b[0] = fVar40;
      _b[1] = fVar40;
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        _b_4._0_8_ = *(undefined8 *)pfVar36;
        _b_4._8_8_ = *(undefined8 *)(pfVar36 + 2);
        afVar87 = BinaryOp_x86_functor::binary_op_rpow::func_pack4((binary_op_rpow *)&op,&_b_4,&_b);
        *puVar31 = afVar87._0_8_;
        puVar31[1] = extraout_XMM0_Qb_00;
        pfVar36 = pfVar36 + 4;
        puVar31 = puVar31 + 2;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = powf(fVar40,*(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar33));
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar33) = fVar39;
      }
    }
    goto switchD_00345174_default;
  case 10:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar33 = 0;
    uVar17 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar17 = uVar33;
    }
    for (; uVar33 != uVar17; uVar33 = uVar33 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar33 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      puVar31 = (undefined8 *)(sVar8 * uVar33 * sVar7 + (long)pvVar6);
      _b[3] = fVar40;
      _b[2] = fVar40;
      _b[0] = fVar40;
      _b[1] = fVar40;
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        _b_4._0_8_ = *(undefined8 *)pfVar36;
        _b_4._8_8_ = *(undefined8 *)(pfVar36 + 2);
        afVar87 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                            ((binary_op_atan2 *)&op,&_b_4,&_b);
        *puVar31 = afVar87._0_8_;
        puVar31[1] = extraout_XMM0_Qb_02;
        pfVar36 = pfVar36 + 4;
        puVar31 = puVar31 + 2;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = atan2f(*(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar33),fVar40);
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar33) = fVar39;
      }
    }
    goto switchD_00345174_default;
  case 0xb:
    iVar23 = m->h * m->w * m->d * m->elempack;
    uVar33 = 0;
    uVar17 = (ulong)(uint)m->c;
    if (m->c < 1) {
      uVar17 = uVar33;
    }
    for (; uVar33 != uVar17; uVar33 = uVar33 + 1) {
      pvVar3 = m->data;
      sVar4 = m->elemsize;
      sVar5 = m->cstep;
      pfVar36 = (float *)(sVar5 * uVar33 * sVar4 + (long)pvVar3);
      pvVar6 = pMVar2->data;
      sVar7 = pMVar2->elemsize;
      sVar8 = pMVar2->cstep;
      puVar31 = (undefined8 *)(sVar8 * uVar33 * sVar7 + (long)pvVar6);
      _b[3] = fVar40;
      _b[2] = fVar40;
      _b[0] = fVar40;
      _b[1] = fVar40;
      lVar19 = 0;
      for (iVar32 = 0; iVar32 + 3 < iVar23; iVar32 = iVar32 + 4) {
        _b_4._0_8_ = *(undefined8 *)pfVar36;
        _b_4._8_8_ = *(undefined8 *)(pfVar36 + 2);
        afVar87 = BinaryOp_x86_functor::binary_op_ratan2::func_pack4(&op,&_b_4,&_b);
        *puVar31 = afVar87._0_8_;
        puVar31[1] = extraout_XMM0_Qb;
        pfVar36 = pfVar36 + 4;
        puVar31 = puVar31 + 2;
        lVar19 = lVar19 + 4;
      }
      for (; (int)lVar19 < iVar23; lVar19 = lVar19 + 1) {
        fVar39 = atan2f(fVar40,*(float *)((long)pvVar3 + lVar19 * 4 + sVar5 * sVar4 * uVar33));
        *(float *)((long)pvVar6 + lVar19 * 4 + sVar8 * sVar7 * uVar33) = fVar39;
      }
    }
switchD_00345174_default:
  }
  return 0;
}

Assistant:

__m256 func_pack8(const __m256& x, const __m256& y) const
    {
        return atan2256_ps(x, y);
    }